

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

bool __thiscall mjs::object::property::key_matches(property *this,gc_heap *h,wstring_view k)

{
  bool bVar1;
  gc_string *this_00;
  wstring_view __x;
  gc_heap *h_local;
  property *this_local;
  wstring_view k_local;
  
  this_00 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->key_,h);
  __x = gc_string::view(this_00);
  bVar1 = std::operator==(__x,k);
  return bVar1;
}

Assistant:

bool key_matches(gc_heap& h, const std::wstring_view k) { return key_.dereference(h).view() == k; }